

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::ActiveBuiltinHandler::add_if_builtin
          (ActiveBuiltinHandler *this,uint32_t id,bool allow_blocks)

{
  Compiler *pCVar1;
  Meta *pMVar2;
  bool bVar3;
  uint32_t uVar4;
  TypedID<(spirv_cross::Types)1> TVar5;
  BuiltIn builtin_00;
  SPIRType *type_00;
  size_t sVar6;
  TypedID *this_00;
  SPIRType *type_01;
  Bitset *decoration_flags;
  Bitset *local_90;
  BuiltIn builtin;
  SPIRType *member_type;
  uint32_t i;
  uint32_t member_count;
  Bitset *flags;
  Decoration *decorations;
  SPIRType *type;
  Meta *local_28;
  Meta *m;
  SPIRVariable *var;
  bool allow_blocks_local;
  ActiveBuiltinHandler *pAStack_10;
  uint32_t id_local;
  ActiveBuiltinHandler *this_local;
  
  var._3_1_ = allow_blocks;
  var._4_4_ = id;
  pAStack_10 = this;
  m = (Meta *)maybe_get<spirv_cross::SPIRVariable>(this->compiler,id);
  pCVar1 = this->compiler;
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)((long)&type + 4),var._4_4_);
  local_28 = ParsedIR::find_meta(&pCVar1->ir,type._4_4_);
  if ((m != (Meta *)0x0) && (local_28 != (Meta *)0x0)) {
    pCVar1 = this->compiler;
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)((long)&(m->decoration).alias._M_string_length + 4));
    type_00 = get<spirv_cross::SPIRType>(pCVar1,uVar4);
    pMVar2 = local_28;
    if (type_00->storage == StorageClassInput) {
      local_90 = &this->compiler->active_input_builtins;
    }
    else {
      local_90 = &this->compiler->active_output_builtins;
    }
    if (((local_28->decoration).builtin & 1U) == 0) {
      if (((var._3_1_ & 1) != 0) &&
         (bVar3 = has_decoration(this->compiler,(ID)(type_00->super_IVariant).self.id,
                                 DecorationBlock), bVar3)) {
        sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          (&(type_00->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
        for (member_type._4_4_ = 0; member_type._4_4_ < (uint)sVar6;
            member_type._4_4_ = member_type._4_4_ + 1) {
          pCVar1 = this->compiler;
          TVar5 = TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
          bVar3 = has_member_decoration(pCVar1,(TypeID)TVar5.id,member_type._4_4_,DecorationBuiltIn)
          ;
          if (bVar3) {
            pCVar1 = this->compiler;
            this_00 = (TypedID *)
                      VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                (&(type_00->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                                 (ulong)member_type._4_4_);
            uVar4 = TypedID::operator_cast_to_unsigned_int(this_00);
            type_01 = get<spirv_cross::SPIRType>(pCVar1,uVar4);
            pCVar1 = this->compiler;
            TVar5 = TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
            builtin_00 = get_member_decoration
                                   (pCVar1,(TypeID)TVar5.id,member_type._4_4_,DecorationBuiltIn);
            Bitset::set(local_90,builtin_00);
            pCVar1 = this->compiler;
            TVar5 = TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
            decoration_flags =
                 get_member_decoration_bitset(pCVar1,(TypeID)TVar5.id,member_type._4_4_);
            handle_builtin(this,type_01,builtin_00,decoration_flags);
          }
        }
      }
    }
    else {
      Bitset::set(local_90,(local_28->decoration).builtin_type);
      handle_builtin(this,type_00,(pMVar2->decoration).builtin_type,
                     &(pMVar2->decoration).decoration_flags);
    }
  }
  return;
}

Assistant:

void Compiler::ActiveBuiltinHandler::add_if_builtin(uint32_t id, bool allow_blocks)
{
	// Only handle plain variables here.
	// Builtins which are part of a block are handled in AccessChain.
	// If allow_blocks is used however, this is to handle initializers of blocks,
	// which implies that all members are written to.

	auto *var = compiler.maybe_get<SPIRVariable>(id);
	auto *m = compiler.ir.find_meta(id);
	if (var && m)
	{
		auto &type = compiler.get<SPIRType>(var->basetype);
		auto &decorations = m->decoration;
		auto &flags = type.storage == StorageClassInput ?
		              compiler.active_input_builtins : compiler.active_output_builtins;
		if (decorations.builtin)
		{
			flags.set(decorations.builtin_type);
			handle_builtin(type, decorations.builtin_type, decorations.decoration_flags);
		}
		else if (allow_blocks && compiler.has_decoration(type.self, DecorationBlock))
		{
			uint32_t member_count = uint32_t(type.member_types.size());
			for (uint32_t i = 0; i < member_count; i++)
			{
				if (compiler.has_member_decoration(type.self, i, DecorationBuiltIn))
				{
					auto &member_type = compiler.get<SPIRType>(type.member_types[i]);
					BuiltIn builtin = BuiltIn(compiler.get_member_decoration(type.self, i, DecorationBuiltIn));
					flags.set(builtin);
					handle_builtin(member_type, builtin, compiler.get_member_decoration_bitset(type.self, i));
				}
			}
		}
	}
}